

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool __thiscall
wallet::CWallet::SignTransaction
          (CWallet *this,CMutableTransaction *tx,
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *coins,int sighash,
          map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
          *input_errors)

{
  char cVar1;
  _Base_ptr p_Var2;
  long in_FS_OFFSET;
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  _Stack_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  GetAllScriptPubKeyMans
            ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
              *)&_Stack_68,this);
  p_Var2 = _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)_Stack_68._M_impl.super__Rb_tree_header._M_header._M_left ==
      &_Stack_68._M_impl.super__Rb_tree_header) {
    cVar1 = '\0';
  }
  else {
    do {
      cVar1 = (**(code **)(**(long **)(p_Var2 + 1) + 0xb8))
                        (*(long **)(p_Var2 + 1),tx,coins,sighash,input_errors);
      if (cVar1 != '\0') break;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != &_Stack_68._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~_Rb_tree(&_Stack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)cVar1;
}

Assistant:

bool CWallet::SignTransaction(CMutableTransaction& tx, const std::map<COutPoint, Coin>& coins, int sighash, std::map<int, bilingual_str>& input_errors) const
{
    // Try to sign with all ScriptPubKeyMans
    for (ScriptPubKeyMan* spk_man : GetAllScriptPubKeyMans()) {
        // spk_man->SignTransaction will return true if the transaction is complete,
        // so we can exit early and return true if that happens
        if (spk_man->SignTransaction(tx, coins, sighash, input_errors)) {
            return true;
        }
    }

    // At this point, one input was not fully signed otherwise we would have exited already
    return false;
}